

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

void __thiscall
kws::Parser::FindProtectedArea(Parser *this,size_t *before,size_t *after,size_t startPos)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  size_t position;
  allocator local_79;
  size_t *local_78;
  string local_70;
  string local_50;
  
  *before = 0;
  *after = 0;
  local_78 = after;
  sVar2 = FindArea(this,"public",startPos);
  uVar3 = FindArea(this,"private",startPos);
  position = FindArea(this,"protected",startPos);
  if (uVar3 == 0xffffffffffffffff) {
    uVar3 = 99999999;
  }
  if (position == 0xffffffffffffffff) {
    position = 99999999;
  }
  if (sVar2 == 0xffffffffffffffff) {
    sVar2 = 99999999;
  }
  if (uVar3 < position || sVar2 < position) {
    if (position < uVar3 || sVar2 < position) {
      *before = position;
      if ((uVar3 < position || position < sVar2) &&
         (uVar3 = FindEndOfClass(this,position), uVar3 == 0xffffffffffffffff)) {
        uVar3 = position;
      }
    }
    else {
      *before = position;
      uVar3 = sVar2;
    }
  }
  else {
    *before = position;
    if (sVar2 <= uVar3) {
      uVar3 = sVar2;
    }
  }
  psVar1 = local_78;
  *local_78 = uVar3;
  if (uVar3 == 99999999) {
    std::__cxx11::string::string((string *)&local_50,"",&local_79);
    sVar2 = GetClassPosition(this,startPos,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if ((sVar2 != 0xffffffffffffffff) &&
       (sVar2 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x154cbe),
       sVar2 != 0xffffffffffffffff)) {
      std::__cxx11::string::string((string *)&local_70,"",&local_79);
      sVar2 = FindClosingChar(this,'{','}',sVar2,true,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (sVar2 != 0xffffffffffffffff) {
        *psVar1 = sVar2;
      }
    }
  }
  return;
}

Assistant:

void Parser::FindProtectedArea(size_t &before, size_t &after, size_t startPos) const
{
  before = 0;
  after = 0;

  // First look if public is before protected and private
  size_t pub = this->FindArea("public", startPos);
  size_t priv = this->FindArea("private", startPos);
  size_t protect = this->FindArea("protected", startPos);

  if(priv == std::string::npos)
    {
    priv = MAX_CHAR;
    }

  if(protect == std::string::npos)
    {
    protect = MAX_CHAR;
    }

  if(pub == std::string::npos)
    {
    pub = MAX_CHAR;
    }

  if(protect>priv || protect>pub)
     {
     if(protect>=priv && protect<=pub)
       {
       before = protect;
       after = pub;
       }
     else if(protect<=priv && protect>=pub)
       {
       before = protect;
       after = priv;
       }
     else
       {
       before = protect;
       size_t eoc = this->FindEndOfClass(protect);
       if(eoc != std::string::npos)
         {
         after = eoc;
         }
       else
         {
         after = protect; // end of class
         }
       }
     }
  else
    {
    before = protect;
    if(priv<pub)
      {
      after = priv;
      }
    else
      {
      after = pub;
      }
    }


  // If there is nothing after we point to the end of the class
  if(after == MAX_CHAR)
    {
    size_t classpos = this->GetClassPosition(startPos);
    if(classpos != std::string::npos)
      {
      size_t posBrace = m_BufferNoComment.find("{",classpos);
      if(posBrace != std::string::npos)
        {
        size_t end = this->FindClosingChar('{','}',posBrace,true);
        if(end != std::string::npos)
          {
          after = end;
          }
        }
      }
    }
}